

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
PS2KeyboardAnalyzerSettings::LoadSettings(PS2KeyboardAnalyzerSettings *this,char *settings)

{
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  PS2KeyboardAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mClockChannel);
  SimpleArchive::operator>>(local_20,&this->mDataChannel);
  SimpleArchive::operator>>(local_20,&this->mDeviceType);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void PS2KeyboardAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mClockChannel;
    text_archive >> mDataChannel;
    text_archive >> mDeviceType;

    ClearChannels();
    AddChannel( mClockChannel, "PS/2 - Clock", true );
    AddChannel( mDataChannel, "PS/2 - Data", true );

    UpdateInterfacesFromSettings();
}